

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O0

uint __thiscall xercesc_4_0::XMLURL::getPortNum(XMLURL *this)

{
  XMLURL *this_local;
  
  if (this->fPortNum == 0) {
    if (this->fProtocol == Unknown) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = *(uint *)(gProtoList + (ulong)this->fProtocol * 0x18 + 0x10);
    }
  }
  else {
    this_local._4_4_ = this->fPortNum;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int XMLURL::getPortNum() const
{
    //
    //  If it was not provided explicitly, then lets return the default one
    //  for the protocol.
    //
    if (!fPortNum)
    {
        if (fProtocol == Unknown)
            return 0;
        return gProtoList[fProtocol].defPort;
    }
    return fPortNum;
}